

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O0

double pae(jas_matrix_t *x,jas_matrix_t *y)

{
  jas_matind_t jVar1;
  jas_seqent_t jVar2;
  jas_seqent_t jVar3;
  undefined8 local_58;
  undefined8 local_38;
  jas_matind_t j;
  jas_matind_t i;
  double d;
  double s;
  jas_matrix_t *y_local;
  jas_matrix_t *x_local;
  
  d = 0.0;
  j = 0;
  while( true ) {
    jVar1 = jas_matrix_numrows(x);
    if (jVar1 <= j) break;
    local_38 = 0;
    while( true ) {
      jVar1 = jas_matrix_numcols(x);
      if (jVar1 <= local_38) break;
      jVar2 = jas_matrix_get(y,j,local_38);
      jVar3 = jas_matrix_get(x,j,local_38);
      if (jVar2 - jVar3 < 0) {
        jVar2 = jas_matrix_get(y,j,local_38);
        jVar3 = jas_matrix_get(x,j,local_38);
        local_58 = -(jVar2 - jVar3);
      }
      else {
        jVar2 = jas_matrix_get(y,j,local_38);
        jVar3 = jas_matrix_get(x,j,local_38);
        local_58 = jVar2 - jVar3;
      }
      if (d < (double)local_58) {
        d = (double)local_58;
      }
      local_38 = local_38 + 1;
    }
    j = j + 1;
  }
  return d;
}

Assistant:

double pae(jas_matrix_t *x, jas_matrix_t *y)
{
	double s;
	double d;

	s = 0.0;
	for (jas_matind_t i = 0; i < jas_matrix_numrows(x); i++) {
		for (jas_matind_t j = 0; j < jas_matrix_numcols(x); j++) {
			d = JAS_ABS(jas_matrix_get(y, i, j) - jas_matrix_get(x, i, j));
			if (d > s) {
				s = d;
			}
		}
	}

	return s;
}